

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_segment.cpp
# Opt level: O0

idx_t duckdb::TemplatedFilterSelection<bool,duckdb::Equals,false>
                (UnifiedVectorFormat *vdata,bool predicate,SelectionVector *sel,
                idx_t approved_tuple_count,SelectionVector *result_sel)

{
  byte bVar1;
  bool *pbVar2;
  SelectionVector *this;
  idx_t idx_00;
  ulong in_RCX;
  SelectionVector *in_RDX;
  byte in_SIL;
  UnifiedVectorFormat *in_RDI;
  bool comparison_result;
  idx_t vector_idx;
  idx_t idx;
  idx_t i;
  idx_t result_count;
  bool *vec;
  ValidityMask *mask;
  undefined7 in_stack_ffffffffffffffa0;
  ulong local_48;
  idx_t local_40;
  bool local_9;
  UnifiedVectorFormat *local_8;
  
  local_9 = (bool)(in_SIL & 1);
  local_8 = in_RDI;
  pbVar2 = UnifiedVectorFormat::GetData<bool>(in_RDI);
  local_40 = 0;
  for (local_48 = 0; local_48 < in_RCX; local_48 = local_48 + 1) {
    this = (SelectionVector *)SelectionVector::get_index(in_RDX,local_48);
    idx_00 = SelectionVector::get_index(local_8->sel,(idx_t)this);
    bVar1 = Equals::Operation<bool>(pbVar2 + idx_00,&local_9);
    SelectionVector::set_index(this,idx_00,CONCAT17(bVar1,in_stack_ffffffffffffffa0));
    local_40 = (bVar1 & 1) + local_40;
  }
  return local_40;
}

Assistant:

static idx_t TemplatedFilterSelection(UnifiedVectorFormat &vdata, T predicate, SelectionVector &sel,
                                      idx_t approved_tuple_count, SelectionVector &result_sel) {
	auto &mask = vdata.validity;
	auto vec = UnifiedVectorFormat::GetData<T>(vdata);
	idx_t result_count = 0;
	for (idx_t i = 0; i < approved_tuple_count; i++) {
		auto idx = sel.get_index(i);
		auto vector_idx = vdata.sel->get_index(idx);
		bool comparison_result =
		    (!HAS_NULL || mask.RowIsValid(vector_idx)) && OP::Operation(vec[vector_idx], predicate);
		result_sel.set_index(result_count, idx);
		result_count += comparison_result;
	}
	return result_count;
}